

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::setupDefaultInputs
          (BuiltinGlFragCoordXYZCaseInstance *this)

{
  float vertices [16];
  
  vertices[0xc] = 1.0;
  vertices[0xd] = -1.0;
  vertices._56_8_ = &DAT_3f8000003f800000;
  vertices._32_8_ = &DAT_3f8000003f800000;
  vertices[10] = 0.5;
  vertices[0xb] = 1.0;
  vertices[4] = -1.0;
  vertices[5] = -1.0;
  vertices[6] = 0.5;
  vertices[7] = 1.0;
  vertices[0] = -1.0;
  vertices[1] = 1.0;
  vertices[2] = 0.0;
  vertices[3] = 1.0;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,vertices);
  return;
}

Assistant:

void BuiltinGlFragCoordXYZCaseInstance::setupDefaultInputs (void)
{
	const float		vertices[]		=
	{
		-1.0f,  1.0f,  0.0f, 1.0f,
		-1.0f, -1.0f,  0.5f, 1.0f,
		 1.0f,  1.0f,  0.5f, 1.0f,
		 1.0f, -1.0f,  1.0f, 1.0f,
	};

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 4, vertices);
}